

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::SQCompiler
          (SQCompiler *this,SQVM *v,SQLEXREADFUNC rg,SQUserPointer up,SQChar *sourcename,
          bool raiseerror,bool lineinfo)

{
  SQInteger in_RCX;
  SQString *in_RDX;
  SQSharedState *in_RSI;
  long in_RDI;
  byte in_R9B;
  byte in_stack_00000008;
  void *in_stack_00000568;
  CompilerErrorFunc in_stack_00000570;
  SQUserPointer in_stack_00000578;
  SQLEXREADFUNC in_stack_00000580;
  SQSharedState *in_stack_00000588;
  SQLexer *in_stack_00000590;
  SQSharedState *ss;
  
  ss = in_RSI;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 0x10));
  SQLexer::SQLexer((SQLexer *)0x11e608);
  *(SQSharedState **)(in_RDI + 0x2c0) = in_RSI;
  SQLexer::Init(in_stack_00000590,in_stack_00000588,in_stack_00000580,in_stack_00000578,
                in_stack_00000570,in_stack_00000568);
  SQString::Create(ss,(SQChar *)in_RDX,in_RCX);
  ::SQObjectPtr::operator=((SQObjectPtr *)ss,in_RDX);
  *(byte *)(in_RDI + 0xb8) = in_stack_00000008 & 1;
  *(byte *)(in_RDI + 0xb9) = in_R9B & 1;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined1 *)(in_RDI + 0xf8) = 0;
  return;
}

Assistant:

SQCompiler(SQVM *v, SQLEXREADFUNC rg, SQUserPointer up, const SQChar* sourcename, bool raiseerror, bool lineinfo)
    {
        _vm=v;
        _lex.Init(_ss(v), rg, up,ThrowError,this);
        _sourcename = SQString::Create(_ss(v), sourcename);
        _lineinfo = lineinfo;_raiseerror = raiseerror;
        _scope.outers = 0;
        _scope.stacksize = 0;
        _compilererror[0] = _SC('\0');
    }